

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void helper_macsatu_m68k(CPUM68KState_conflict *env,uint32_t acc)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = env->macc[acc];
  uVar3 = env->macsr;
  if (0xffffffffffff < uVar1) {
    uVar3 = uVar3 | 2;
    env->macsr = uVar3;
  }
  uVar2 = uVar1;
  if ((uVar3 & 2) != 0) {
    env->macsr = 0x100 << ((byte)acc & 0x1f) | uVar3;
    if ((char)uVar3 < '\0') {
      uVar2 = 0xffffffffffff;
      if (0x20000000000000 < uVar1) {
        uVar2 = 0;
      }
    }
    else {
      uVar2 = uVar1 & 0xffffffffffff;
    }
  }
  env->macc[acc] = uVar2;
  return;
}

Assistant:

void HELPER(macsatu)(CPUM68KState *env, uint32_t acc)
{
    uint64_t val;

    val = env->macc[acc];
    if (val & (0xffffull << 48)) {
        env->macsr |= MACSR_V;
    }
    if (env->macsr & MACSR_V) {
        env->macsr |= MACSR_PAV0 << acc;
        if (env->macsr & MACSR_OMC) {
            if (val > (1ull << 53))
                val = 0;
            else
                val = (1ull << 48) - 1;
        } else {
            val &= ((1ull << 48) - 1);
        }
    }
    env->macc[acc] = val;
}